

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

ogt_vox_transform *
ogt_vox_sample_group_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_group *group,uint32_t frame_index,
          ogt_vox_scene *scene)

{
  uint32_t uVar1;
  ogt_vox_group *poVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint uVar18;
  ogt_vox_transform group_transform;
  ogt_vox_transform local_b8;
  ogt_vox_transform local_70;
  
  uVar1 = (group->transform_anim).num_keyframes;
  if (uVar1 == 0) {
    fVar14 = (group->transform).m00;
    fVar15 = (group->transform).m01;
    fVar16 = (group->transform).m02;
    fVar17 = (group->transform).m03;
    fVar10 = (group->transform).m10;
    fVar11 = (group->transform).m11;
    fVar12 = (group->transform).m12;
    fVar13 = (group->transform).m13;
    fVar6 = (group->transform).m20;
    fVar7 = (group->transform).m21;
    fVar8 = (group->transform).m22;
    fVar9 = (group->transform).m23;
    fVar3 = (group->transform).m31;
    fVar4 = (group->transform).m32;
    fVar5 = (group->transform).m33;
    __return_storage_ptr__->m30 = (group->transform).m30;
    __return_storage_ptr__->m31 = fVar3;
    __return_storage_ptr__->m32 = fVar4;
    __return_storage_ptr__->m33 = fVar5;
    __return_storage_ptr__->m20 = fVar6;
    __return_storage_ptr__->m21 = fVar7;
    __return_storage_ptr__->m22 = fVar8;
    __return_storage_ptr__->m23 = fVar9;
    __return_storage_ptr__->m10 = fVar10;
    __return_storage_ptr__->m11 = fVar11;
    __return_storage_ptr__->m12 = fVar12;
    __return_storage_ptr__->m13 = fVar13;
    __return_storage_ptr__->m00 = fVar14;
    __return_storage_ptr__->m01 = fVar15;
    __return_storage_ptr__->m02 = fVar16;
    __return_storage_ptr__->m03 = fVar17;
  }
  else {
    sample_keyframe_transform
              (__return_storage_ptr__,(group->transform_anim).keyframes,uVar1,
               (group->transform_anim).loop,frame_index);
  }
  uVar18 = group->parent_group_index;
  if (uVar18 != 0xffffffff) {
    do {
      poVar2 = scene->groups;
      uVar1 = poVar2[uVar18].transform_anim.num_keyframes;
      if (uVar1 == 0) {
        local_b8.m00 = poVar2[uVar18].transform.m00;
        local_b8.m01 = poVar2[uVar18].transform.m01;
        local_b8.m02 = poVar2[uVar18].transform.m02;
        local_b8.m03 = poVar2[uVar18].transform.m03;
        local_b8.m10 = poVar2[uVar18].transform.m10;
        local_b8.m11 = poVar2[uVar18].transform.m11;
        local_b8.m12 = poVar2[uVar18].transform.m12;
        local_b8.m13 = poVar2[uVar18].transform.m13;
        local_b8.m20 = poVar2[uVar18].transform.m20;
        local_b8.m21 = poVar2[uVar18].transform.m21;
        local_b8.m22 = poVar2[uVar18].transform.m22;
        local_b8.m23 = poVar2[uVar18].transform.m23;
        local_b8.m30 = poVar2[uVar18].transform.m30;
        local_b8.m31 = poVar2[uVar18].transform.m31;
        local_b8.m32 = poVar2[uVar18].transform.m32;
        local_b8.m33 = poVar2[uVar18].transform.m33;
      }
      else {
        sample_keyframe_transform
                  (&local_b8,poVar2[uVar18].transform_anim.keyframes,uVar1,
                   poVar2[uVar18].transform_anim.loop,frame_index);
      }
      ogt_vox_transform_multiply(&local_70,__return_storage_ptr__,&local_b8);
      __return_storage_ptr__->m30 = local_70.m30;
      __return_storage_ptr__->m31 = local_70.m31;
      __return_storage_ptr__->m32 = local_70.m32;
      __return_storage_ptr__->m33 = local_70.m33;
      __return_storage_ptr__->m20 = local_70.m20;
      __return_storage_ptr__->m21 = local_70.m21;
      __return_storage_ptr__->m22 = local_70.m22;
      __return_storage_ptr__->m23 = local_70.m23;
      __return_storage_ptr__->m10 = local_70.m10;
      __return_storage_ptr__->m11 = local_70.m11;
      __return_storage_ptr__->m12 = local_70.m12;
      __return_storage_ptr__->m13 = local_70.m13;
      __return_storage_ptr__->m00 = local_70.m00;
      __return_storage_ptr__->m01 = local_70.m01;
      __return_storage_ptr__->m02 = local_70.m02;
      __return_storage_ptr__->m03 = local_70.m03;
      uVar18 = poVar2[uVar18].parent_group_index;
    } while (uVar18 != 0xffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_group_transform_global(const ogt_vox_group* group, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform flattened_transform = ogt_vox_sample_group_transform_local(group, frame_index);
        uint32_t group_index = group->parent_group_index;
        while (group_index != k_invalid_group_index) {
            group = &scene->groups[group_index];
            ogt_vox_transform group_transform = ogt_vox_sample_group_transform_local(group, frame_index);
            flattened_transform = ogt_vox_transform_multiply(flattened_transform, group_transform);
            group_index = group->parent_group_index;
        }
        return flattened_transform;
    }